

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

QLayoutItem * __thiscall QFormLayout::takeAt(QFormLayout *this,int index)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  QFormLayoutItem *item;
  int iVar4;
  pointer ppQVar5;
  QLayoutItem *pQVar6;
  long lVar7;
  ulong i;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QLayout).field_0x8;
  i = (ulong)index;
  if (((i < *(ulong *)(lVar2 + 0xe8)) &&
      (lVar3 = *(long *)(*(long *)(lVar2 + 0xe0) + i * 8), lVar3 != 0)) &&
     (*(long *)(lVar2 + 0xd0) != 0)) {
    iVar4 = 1;
    lVar7 = 0;
    do {
      if (*(long *)(lVar2 + 0xd0) << 3 == lVar7) goto LAB_0039b87b;
      iVar4 = iVar4 + -1;
      plVar1 = (long *)(*(long *)(lVar2 + 200) + lVar7);
      lVar7 = lVar7 + 8;
    } while (*plVar1 != lVar3);
    if (iVar4 != 1) {
      iVar4 = -iVar4;
      iVar4 = iVar4 % 2 + (iVar4 - (iVar4 >> 0x1f) & 0xfffffffeU);
      ppQVar5 = QList<QFormLayoutItem_*>::data((QList<QFormLayoutItem_*> *)(lVar2 + 0xc0));
      item = ppQVar5[iVar4];
      QList<QFormLayoutItem_*>::removeAt((QList<QFormLayoutItem_*> *)(lVar2 + 0xd8),i);
      ppQVar5 = QList<QFormLayoutItem_*>::data((QList<QFormLayoutItem_*> *)(lVar2 + 0xc0));
      ppQVar5[iVar4] = (QFormLayoutItem *)0x0;
      (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        pQVar6 = ownershipCleanedItem(item,this);
        return pQVar6;
      }
      goto LAB_0039b8cc;
    }
  }
LAB_0039b87b:
  local_58[0] = '\x02';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_40 = "default";
  QMessageLogger::warning(local_58,"QFormLayout::takeAt: Invalid index %d",index);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QLayoutItem *)0x0;
  }
LAB_0039b8cc:
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QFormLayout::takeAt(int index)
{
    Q_D(QFormLayout);

    const int storageIndex = storageIndexFromLayoutItem(d->m_matrix, d->m_things.value(index));
    if (Q_UNLIKELY(storageIndex == -1)) {
        qWarning("QFormLayout::takeAt: Invalid index %d", index);
        return nullptr;
    }

    int row, col;
    QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);
    Q_ASSERT(d->m_matrix(row, col));

    QFormLayoutItem *item = d->m_matrix(row, col);
    Q_ASSERT(item);
    d->m_things.removeAt(index);
    d->m_matrix(row, col) = 0;

    invalidate();

    return ownershipCleanedItem(item, this);
}